

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O0

void __thiscall InputGraph::set_vertex_label(InputGraph *this,int v,string_view l)

{
  pointer pIVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  int in_ESI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char *in_stack_00000130;
  undefined1 in_stack_00000138 [16];
  
  anon_unknown.dwarf_f6ec7::sanity_check_name((string_view)in_stack_00000138,in_stack_00000130);
  pIVar1 = std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
                     ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x16a733
                     );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&pIVar1->vertex_labels,(long)in_ESI);
  std::__cxx11::string::operator=(in_RDX,in_RDI);
  return;
}

Assistant:

auto InputGraph::set_vertex_label(int v, string_view l) -> void
{
    sanity_check_name(l, "vertex label");
    _imp->vertex_labels[v] = l;
}